

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopup(char *str_id,ImGuiWindowFlags flags)

{
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiContext *g;
  ImGuiID in_stack_00000010;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    ImGuiWindow::GetID(unaff_retaddr,
                       (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI)
    ;
    bVar1 = BeginPopupEx(in_stack_00000010,g._4_4_);
  }
  else {
    ImGuiNextWindowData::ClearFlags(&GImGui->NextWindowData);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginPopup(const char* str_id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size <= g.BeginPopupStack.Size) // Early out for performance
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }
    flags |= ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings;
    return BeginPopupEx(g.CurrentWindow->GetID(str_id), flags);
}